

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_winograd_transform_pack4.h
# Opt level: O0

void ncnn::conv3x3s1_winograd63_transform_input_pack4_sse
               (Mat *bottom_blob,Mat *bottom_blob_tm,Option *opt)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  long lVar51;
  int iVar52;
  int iVar53;
  int iVar54;
  long *in_RSI;
  long *in_RDI;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  __m128 _r0tm6;
  __m128 _r0tm5;
  __m128 _tmp56b_1;
  __m128 _tmp56a_1;
  __m128 _r0tm4;
  __m128 _r0tm3;
  __m128 _tmp34b_1;
  __m128 _tmp34a_1;
  __m128 _r0tm2;
  __m128 _r0tm1;
  __m128 _tmp12b_1;
  __m128 _tmp12a_1;
  __m128 _r0tm7;
  __m128 _r0tm0;
  __m128 _tmp07;
  __m128 _tmp06;
  __m128 _tmp05;
  __m128 _tmp04;
  __m128 _tmp03;
  __m128 _tmp02;
  __m128 _tmp01;
  __m128 _tmp00;
  int m_3;
  float *r0_tm_7;
  float *r0_tm_6;
  float *r0_tm_5;
  float *r0_tm_4;
  float *r0_tm_3;
  float *r0_tm_2;
  float *r0_tm_1;
  float *r0_tm_0;
  __m128 _tmp6m;
  __m128 _tmp5m;
  __m128 _tmp56b;
  __m128 _tmp56a;
  __m128 _tmp4m;
  __m128 _tmp3m;
  __m128 _tmp34b;
  __m128 _tmp34a;
  __m128 _tmp2m;
  __m128 _tmp1m;
  __m128 _tmp12b;
  __m128 _tmp12a;
  __m128 _tmp7m;
  __m128 _tmp0m;
  __m128 _r07;
  __m128 _r06;
  __m128 _r05;
  __m128 _r04;
  __m128 _r03;
  __m128 _r02;
  __m128 _r01;
  __m128 _r00;
  int m_2;
  float *r0;
  int j;
  int i;
  __m128 _v4;
  __m128 _v2;
  __m128 _v0_5;
  __m128 _vm2_5;
  __m128 _v0_25;
  __m128 _vm1_25;
  __m128 _vm4_25;
  __m128 _v5_25;
  float tmp [8] [8] [4];
  Mat img0_tm;
  Mat img0;
  int q;
  int tiles;
  int h_tiles;
  int w_tiles;
  int inch;
  int h;
  int w;
  Mat *m_1;
  Mat *m;
  undefined8 local_1ba8;
  undefined8 uStack_1ba0;
  undefined8 local_1b68;
  undefined8 uStack_1b60;
  undefined8 local_1b28;
  undefined8 uStack_1b20;
  int local_1a3c;
  undefined8 *local_1a38;
  undefined8 *local_1a30;
  undefined8 *local_1a28;
  undefined8 *local_1a20;
  undefined8 *local_1a18;
  undefined8 *local_1a10;
  undefined8 *local_1a08;
  undefined8 *local_1a00;
  long local_19f8;
  long lStack_19f0;
  long local_19b8;
  long lStack_19b0;
  long local_1978;
  long lStack_1970;
  int local_188c;
  undefined1 (*local_1888) [16];
  int local_1880;
  int local_187c;
  long local_17f8 [148];
  int local_1354;
  float local_f38;
  float fStack_f34;
  float fStack_f30;
  float fStack_f2c;
  float local_f28;
  float fStack_f24;
  float fStack_f20;
  float fStack_f1c;
  float local_f18;
  float fStack_f14;
  float fStack_f10;
  float fStack_f0c;
  float local_f08;
  float fStack_f04;
  float fStack_f00;
  float fStack_efc;
  float local_e98;
  float fStack_e94;
  float fStack_e90;
  float fStack_e8c;
  float local_e88;
  float fStack_e84;
  float fStack_e80;
  float fStack_e7c;
  float local_e78;
  float fStack_e74;
  float fStack_e70;
  float fStack_e6c;
  float local_e68;
  float fStack_e64;
  float fStack_e60;
  float fStack_e5c;
  float local_b08;
  float fStack_b04;
  float fStack_b00;
  float fStack_afc;
  float local_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float local_748;
  float fStack_744;
  float fStack_740;
  float fStack_73c;
  float local_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float local_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float local_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  
  iVar1 = *(int *)((long)in_RDI + 0x2c);
  lVar51 = in_RDI[7];
  iVar52 = (iVar1 + -2) / 6;
  iVar53 = ((int)in_RDI[6] + -2) / 6;
  iVar54 = iVar52 * iVar53;
  for (local_1354 = 0; local_1354 < (int)lVar51; local_1354 = local_1354 + 1) {
    iVar2 = *(int *)((long)in_RDI + 0x2c);
    lVar3 = *in_RDI;
    lVar4 = in_RDI[8];
    lVar5 = in_RDI[2];
    lVar6 = in_RDI[2];
    local_17f8[0x82] = *in_RSI + in_RSI[8] * (long)local_1354 * in_RSI[2];
    for (local_187c = 0; local_187c < iVar53; local_187c = local_187c + 1) {
      for (local_1880 = 0; local_1880 < iVar52; local_1880 = local_1880 + 1) {
        local_1888 = (undefined1 (*) [16])
                     (lVar3 + lVar4 * local_1354 * lVar5 +
                      (long)iVar2 * (long)(local_187c * 6) * lVar6 + (long)(local_1880 * 0x18) * 4);
        for (local_188c = 0; local_188c < 8; local_188c = local_188c + 1) {
          uVar10 = *(undefined8 *)local_1888[1];
          uVar11 = *(undefined8 *)(local_1888[1] + 8);
          uVar12 = *(undefined8 *)local_1888[2];
          uVar13 = *(undefined8 *)(local_1888[2] + 8);
          uVar14 = *(undefined8 *)local_1888[3];
          uVar15 = *(undefined8 *)(local_1888[3] + 8);
          uVar16 = *(undefined8 *)local_1888[4];
          uVar17 = *(undefined8 *)(local_1888[4] + 8);
          uVar18 = *(undefined8 *)local_1888[5];
          uVar19 = *(undefined8 *)(local_1888[5] + 8);
          uVar20 = *(undefined8 *)local_1888[6];
          uVar21 = *(undefined8 *)(local_1888[6] + 8);
          auVar7 = vsubps_avx(local_1888[4],local_1888[2]);
          auVar8 = vsubps_avx(*local_1888,local_1888[6]);
          local_6d8 = auVar7._0_4_;
          fStack_6d4 = auVar7._4_4_;
          fStack_6d0 = auVar7._8_4_;
          fStack_6cc = auVar7._12_4_;
          local_6f8 = auVar8._0_4_;
          fStack_6f4 = auVar8._4_4_;
          fStack_6f0 = auVar8._8_4_;
          fStack_6ec = auVar8._12_4_;
          auVar7 = vsubps_avx(local_1888[3],local_1888[5]);
          auVar8 = vsubps_avx(local_1888[7],local_1888[1]);
          local_6b8 = auVar7._0_4_;
          fStack_6b4 = auVar7._4_4_;
          fStack_6b0 = auVar7._8_4_;
          fStack_6ac = auVar7._12_4_;
          local_748 = auVar8._0_4_;
          fStack_744 = auVar8._4_4_;
          fStack_740 = auVar8._8_4_;
          fStack_73c = auVar8._12_4_;
          local_17f8[(long)local_188c * 2] =
               CONCAT44(fStack_6d4 * 5.25 + fStack_6f4,local_6d8 * 5.25 + local_6f8);
          local_17f8[(long)local_188c * 2 + 1] =
               CONCAT44(fStack_6cc * 5.25 + fStack_6ec,fStack_6d0 * 5.25 + fStack_6f0);
          local_17f8[(long)local_188c * 2 + 0x70] =
               CONCAT44(fStack_6b4 * 5.25 + fStack_744,local_6b8 * 5.25 + local_748);
          local_17f8[(long)local_188c * 2 + 0x71] =
               CONCAT44(fStack_6ac * 5.25 + fStack_73c,fStack_6b0 * 5.25 + fStack_740);
          local_e68 = (float)uVar12;
          fStack_e64 = (float)((ulong)uVar12 >> 0x20);
          fStack_e60 = (float)uVar13;
          fStack_e5c = (float)((ulong)uVar13 >> 0x20);
          local_e78 = (float)uVar20;
          fStack_e74 = (float)((ulong)uVar20 >> 0x20);
          fStack_e70 = (float)uVar21;
          fStack_e6c = (float)((ulong)uVar21 >> 0x20);
          local_698 = (float)uVar16;
          fStack_694 = (float)((ulong)uVar16 >> 0x20);
          fStack_690 = (float)uVar17;
          fStack_68c = (float)((ulong)uVar17 >> 0x20);
          fVar55 = local_698 * -4.25 + local_e68 + local_e78;
          fVar57 = fStack_694 * -4.25 + fStack_e64 + fStack_e74;
          fVar61 = fStack_690 * -4.25 + fStack_e60 + fStack_e70;
          fVar68 = fStack_68c * -4.25 + fStack_e5c + fStack_e6c;
          auVar50._4_4_ = fVar57;
          auVar50._0_4_ = fVar55;
          auVar50._12_4_ = fVar68;
          auVar50._8_4_ = fVar61;
          local_e88 = (float)uVar10;
          fStack_e84 = (float)((ulong)uVar10 >> 0x20);
          fStack_e80 = (float)uVar11;
          fStack_e7c = (float)((ulong)uVar11 >> 0x20);
          local_e98 = (float)uVar18;
          fStack_e94 = (float)((ulong)uVar18 >> 0x20);
          fStack_e90 = (float)uVar19;
          fStack_e8c = (float)((ulong)uVar19 >> 0x20);
          local_678 = (float)uVar14;
          fStack_674 = (float)((ulong)uVar14 >> 0x20);
          fStack_670 = (float)uVar15;
          fStack_66c = (float)((ulong)uVar15 >> 0x20);
          fVar56 = local_678 * -4.25 + local_e88 + local_e98;
          fVar58 = fStack_674 * -4.25 + fStack_e84 + fStack_e94;
          fVar62 = fStack_670 * -4.25 + fStack_e80 + fStack_e90;
          fVar69 = fStack_66c * -4.25 + fStack_e7c + fStack_e8c;
          auVar49._4_4_ = fVar58;
          auVar49._0_4_ = fVar56;
          auVar49._12_4_ = fVar69;
          auVar49._8_4_ = fVar62;
          auVar7 = vsubps_avx(auVar50,auVar49);
          local_17f8[(long)local_188c * 2 + 0x10] = CONCAT44(fVar57 + fVar58,fVar55 + fVar56);
          local_17f8[(long)local_188c * 2 + 0x11] = CONCAT44(fVar68 + fVar69,fVar61 + fVar62);
          local_1978 = auVar7._0_8_;
          lStack_1970 = auVar7._8_8_;
          local_17f8[(long)local_188c * 2 + 0x20] = local_1978;
          local_17f8[(long)local_188c * 2 + 0x21] = lStack_1970;
          fVar55 = local_698 * -1.25 + local_e68 * 0.25 + local_e78;
          fVar57 = fStack_694 * -1.25 + fStack_e64 * 0.25 + fStack_e74;
          fVar61 = fStack_690 * -1.25 + fStack_e60 * 0.25 + fStack_e70;
          fVar68 = fStack_68c * -1.25 + fStack_e5c * 0.25 + fStack_e6c;
          auVar48._4_4_ = fVar57;
          auVar48._0_4_ = fVar55;
          auVar48._12_4_ = fVar68;
          auVar48._8_4_ = fVar61;
          fVar56 = local_e98 * 2.0 + local_678 * -2.5 + local_e88 * 0.5;
          fVar58 = fStack_e94 * 2.0 + fStack_674 * -2.5 + fStack_e84 * 0.5;
          fVar62 = fStack_e90 * 2.0 + fStack_670 * -2.5 + fStack_e80 * 0.5;
          fVar69 = fStack_e8c * 2.0 + fStack_66c * -2.5 + fStack_e7c * 0.5;
          auVar9._4_4_ = fVar58;
          auVar9._0_4_ = fVar56;
          auVar9._12_4_ = fVar69;
          auVar9._8_4_ = fVar62;
          auVar7 = vsubps_avx(auVar48,auVar9);
          local_17f8[(long)local_188c * 2 + 0x30] = CONCAT44(fVar57 + fVar58,fVar55 + fVar56);
          local_17f8[(long)local_188c * 2 + 0x31] = CONCAT44(fVar68 + fVar69,fVar61 + fVar62);
          local_19b8 = auVar7._0_8_;
          lStack_19b0 = auVar7._8_8_;
          local_17f8[(long)local_188c * 2 + 0x40] = local_19b8;
          local_17f8[(long)local_188c * 2 + 0x41] = lStack_19b0;
          local_e78 = (local_698 * -1.25 + local_e68) * 4.0 + local_e78;
          fStack_e74 = (fStack_694 * -1.25 + fStack_e64) * 4.0 + fStack_e74;
          fStack_e70 = (fStack_690 * -1.25 + fStack_e60) * 4.0 + fStack_e70;
          fStack_e6c = (fStack_68c * -1.25 + fStack_e5c) * 4.0 + fStack_e6c;
          auVar8._4_4_ = fStack_e74;
          auVar8._0_4_ = local_e78;
          auVar8._12_4_ = fStack_e6c;
          auVar8._8_4_ = fStack_e70;
          fVar55 = local_e98 * 0.5 + local_678 * -2.5 + local_e88 * 2.0;
          fVar56 = fStack_e94 * 0.5 + fStack_674 * -2.5 + fStack_e84 * 2.0;
          fVar57 = fStack_e90 * 0.5 + fStack_670 * -2.5 + fStack_e80 * 2.0;
          fVar58 = fStack_e8c * 0.5 + fStack_66c * -2.5 + fStack_e7c * 2.0;
          auVar7._4_4_ = fVar56;
          auVar7._0_4_ = fVar55;
          auVar7._12_4_ = fVar58;
          auVar7._8_4_ = fVar57;
          auVar7 = vsubps_avx(auVar8,auVar7);
          local_17f8[(long)local_188c * 2 + 0x50] = CONCAT44(fStack_e74 + fVar56,local_e78 + fVar55)
          ;
          local_17f8[(long)local_188c * 2 + 0x51] =
               CONCAT44(fStack_e6c + fVar58,fStack_e70 + fVar57);
          local_19f8 = auVar7._0_8_;
          lStack_19f0 = auVar7._8_8_;
          local_17f8[(long)local_188c * 2 + 0x60] = local_19f8;
          local_17f8[(long)local_188c * 2 + 0x61] = lStack_19f0;
          local_1888 = (undefined1 (*) [16])(*local_1888 + (long)(iVar1 << 2) * 4);
        }
        local_1a00 = (undefined8 *)
                     (local_17f8[0x82] + (long)((local_187c * iVar52 + local_1880) * 4) * 4);
        local_1a08 = (undefined8 *)((long)local_1a00 + (long)(iVar54 * 4) * 4);
        local_1a10 = (undefined8 *)((long)local_1a00 + (long)(iVar54 * 8) * 4);
        local_1a18 = (undefined8 *)((long)local_1a00 + (long)(iVar54 * 0xc) * 4);
        local_1a20 = (undefined8 *)((long)local_1a00 + (long)(iVar54 * 0x10) * 4);
        local_1a28 = (undefined8 *)((long)local_1a00 + (long)(iVar54 * 0x14) * 4);
        local_1a30 = (undefined8 *)((long)local_1a00 + (long)(iVar54 * 0x18) * 4);
        local_1a38 = (undefined8 *)((long)local_1a00 + (long)(iVar54 * 0x1c) * 4);
        for (local_1a3c = 0; local_1a3c < 8; local_1a3c = local_1a3c + 1) {
          lVar22 = local_17f8[(long)local_1a3c * 0x10 + 2];
          lVar23 = local_17f8[(long)local_1a3c * 0x10 + 3];
          lVar24 = local_17f8[(long)local_1a3c * 0x10 + 4];
          lVar25 = local_17f8[(long)local_1a3c * 0x10 + 5];
          lVar26 = local_17f8[(long)local_1a3c * 0x10 + 6];
          lVar27 = local_17f8[(long)local_1a3c * 0x10 + 7];
          lVar28 = local_17f8[(long)local_1a3c * 0x10 + 8];
          lVar29 = local_17f8[(long)local_1a3c * 0x10 + 9];
          lVar30 = local_17f8[(long)local_1a3c * 0x10 + 10];
          lVar31 = local_17f8[(long)local_1a3c * 0x10 + 0xb];
          lVar32 = local_17f8[(long)local_1a3c * 0x10 + 0xc];
          lVar33 = local_17f8[(long)local_1a3c * 0x10 + 0xd];
          auVar47._8_8_ = lVar29;
          auVar47._0_8_ = lVar28;
          auVar46._8_8_ = lVar25;
          auVar46._0_8_ = lVar24;
          auVar7 = vsubps_avx(auVar47,auVar46);
          auVar45._8_8_ = local_17f8[(long)local_1a3c * 0x10 + 1];
          auVar45._0_8_ = local_17f8[(long)local_1a3c * 0x10];
          auVar44._8_8_ = lVar33;
          auVar44._0_8_ = lVar32;
          auVar8 = vsubps_avx(auVar45,auVar44);
          local_558 = auVar7._0_4_;
          fStack_554 = auVar7._4_4_;
          fStack_550 = auVar7._8_4_;
          fStack_54c = auVar7._12_4_;
          local_ab8 = auVar8._0_4_;
          fStack_ab4 = auVar8._4_4_;
          fStack_ab0 = auVar8._8_4_;
          fStack_aac = auVar8._12_4_;
          auVar43._8_8_ = lVar27;
          auVar43._0_8_ = lVar26;
          auVar42._8_8_ = lVar31;
          auVar42._0_8_ = lVar30;
          auVar7 = vsubps_avx(auVar43,auVar42);
          auVar41._8_8_ = local_17f8[(long)local_1a3c * 0x10 + 0xf];
          auVar41._0_8_ = local_17f8[(long)local_1a3c * 0x10 + 0xe];
          auVar40._8_8_ = lVar23;
          auVar40._0_8_ = lVar22;
          auVar8 = vsubps_avx(auVar41,auVar40);
          local_538 = auVar7._0_4_;
          fStack_534 = auVar7._4_4_;
          fStack_530 = auVar7._8_4_;
          fStack_52c = auVar7._12_4_;
          local_b08 = auVar8._0_4_;
          fStack_b04 = auVar8._4_4_;
          fStack_b00 = auVar8._8_4_;
          fStack_afc = auVar8._12_4_;
          local_f08 = (float)lVar24;
          fStack_f04 = (float)((ulong)lVar24 >> 0x20);
          fStack_f00 = (float)lVar25;
          fStack_efc = (float)((ulong)lVar25 >> 0x20);
          local_f18 = (float)lVar32;
          fStack_f14 = (float)((ulong)lVar32 >> 0x20);
          fStack_f10 = (float)lVar33;
          fStack_f0c = (float)((ulong)lVar33 >> 0x20);
          local_518 = (float)lVar28;
          fStack_514 = (float)((ulong)lVar28 >> 0x20);
          fStack_510 = (float)lVar29;
          fStack_50c = (float)((ulong)lVar29 >> 0x20);
          fVar55 = local_518 * -4.25 + local_f08 + local_f18;
          fVar62 = fStack_514 * -4.25 + fStack_f04 + fStack_f14;
          fVar63 = fStack_510 * -4.25 + fStack_f00 + fStack_f10;
          fVar70 = fStack_50c * -4.25 + fStack_efc + fStack_f0c;
          auVar39._4_4_ = fVar62;
          auVar39._0_4_ = fVar55;
          auVar39._12_4_ = fVar70;
          auVar39._8_4_ = fVar63;
          local_f28 = (float)lVar22;
          fStack_f24 = (float)((ulong)lVar22 >> 0x20);
          fStack_f20 = (float)lVar23;
          fStack_f1c = (float)((ulong)lVar23 >> 0x20);
          local_f38 = (float)lVar30;
          fStack_f34 = (float)((ulong)lVar30 >> 0x20);
          fStack_f30 = (float)lVar31;
          fStack_f2c = (float)((ulong)lVar31 >> 0x20);
          local_4f8 = (float)lVar26;
          fStack_4f4 = (float)((ulong)lVar26 >> 0x20);
          fStack_4f0 = (float)lVar27;
          fStack_4ec = (float)((ulong)lVar27 >> 0x20);
          fVar56 = local_4f8 * -4.25 + local_f28 + local_f38;
          fVar68 = fStack_4f4 * -4.25 + fStack_f24 + fStack_f34;
          fVar64 = fStack_4f0 * -4.25 + fStack_f20 + fStack_f30;
          fVar71 = fStack_4ec * -4.25 + fStack_f1c + fStack_f2c;
          auVar38._4_4_ = fVar68;
          auVar38._0_4_ = fVar56;
          auVar38._12_4_ = fVar71;
          auVar38._8_4_ = fVar64;
          auVar7 = vsubps_avx(auVar39,auVar38);
          fVar57 = local_518 * -1.25 + local_f08 * 0.25 + local_f18;
          fVar69 = fStack_514 * -1.25 + fStack_f04 * 0.25 + fStack_f14;
          fVar65 = fStack_510 * -1.25 + fStack_f00 * 0.25 + fStack_f10;
          fVar72 = fStack_50c * -1.25 + fStack_efc * 0.25 + fStack_f0c;
          auVar37._4_4_ = fVar69;
          auVar37._0_4_ = fVar57;
          auVar37._12_4_ = fVar72;
          auVar37._8_4_ = fVar65;
          fVar58 = local_f38 * 2.0 + local_4f8 * -2.5 + local_f28 * 0.5;
          fVar59 = fStack_f34 * 2.0 + fStack_4f4 * -2.5 + fStack_f24 * 0.5;
          fVar66 = fStack_f30 * 2.0 + fStack_4f0 * -2.5 + fStack_f20 * 0.5;
          fVar73 = fStack_f2c * 2.0 + fStack_4ec * -2.5 + fStack_f1c * 0.5;
          auVar36._4_4_ = fVar59;
          auVar36._0_4_ = fVar58;
          auVar36._12_4_ = fVar73;
          auVar36._8_4_ = fVar66;
          auVar8 = vsubps_avx(auVar37,auVar36);
          local_f18 = (local_518 * -1.25 + local_f08) * 4.0 + local_f18;
          fStack_f14 = (fStack_514 * -1.25 + fStack_f04) * 4.0 + fStack_f14;
          fStack_f10 = (fStack_510 * -1.25 + fStack_f00) * 4.0 + fStack_f10;
          fStack_f0c = (fStack_50c * -1.25 + fStack_efc) * 4.0 + fStack_f0c;
          auVar35._4_4_ = fStack_f14;
          auVar35._0_4_ = local_f18;
          auVar35._12_4_ = fStack_f0c;
          auVar35._8_4_ = fStack_f10;
          fVar61 = local_f38 * 0.5 + local_4f8 * -2.5 + local_f28 * 2.0;
          fVar60 = fStack_f34 * 0.5 + fStack_4f4 * -2.5 + fStack_f24 * 2.0;
          fVar67 = fStack_f30 * 0.5 + fStack_4f0 * -2.5 + fStack_f20 * 2.0;
          fVar74 = fStack_f2c * 0.5 + fStack_4ec * -2.5 + fStack_f1c * 2.0;
          auVar34._4_4_ = fVar60;
          auVar34._0_4_ = fVar61;
          auVar34._12_4_ = fVar74;
          auVar34._8_4_ = fVar67;
          auVar9 = vsubps_avx(auVar35,auVar34);
          *local_1a00 = CONCAT44(fStack_554 * 5.25 + fStack_ab4,local_558 * 5.25 + local_ab8);
          local_1a00[1] = CONCAT44(fStack_54c * 5.25 + fStack_aac,fStack_550 * 5.25 + fStack_ab0);
          *local_1a08 = CONCAT44(fVar62 + fVar68,fVar55 + fVar56);
          local_1a08[1] = CONCAT44(fVar70 + fVar71,fVar63 + fVar64);
          local_1b28 = auVar7._0_8_;
          uStack_1b20 = auVar7._8_8_;
          *local_1a10 = local_1b28;
          local_1a10[1] = uStack_1b20;
          *local_1a18 = CONCAT44(fVar69 + fVar59,fVar57 + fVar58);
          local_1a18[1] = CONCAT44(fVar72 + fVar73,fVar65 + fVar66);
          local_1b68 = auVar8._0_8_;
          uStack_1b60 = auVar8._8_8_;
          *local_1a20 = local_1b68;
          local_1a20[1] = uStack_1b60;
          *local_1a28 = CONCAT44(fStack_f14 + fVar60,local_f18 + fVar61);
          local_1a28[1] = CONCAT44(fStack_f0c + fVar74,fStack_f10 + fVar67);
          local_1ba8 = auVar9._0_8_;
          uStack_1ba0 = auVar9._8_8_;
          *local_1a30 = local_1ba8;
          local_1a30[1] = uStack_1ba0;
          *local_1a38 = CONCAT44(fStack_534 * 5.25 + fStack_b04,local_538 * 5.25 + local_b08);
          local_1a38[1] = CONCAT44(fStack_52c * 5.25 + fStack_afc,fStack_530 * 5.25 + fStack_b00);
          local_1a00 = (undefined8 *)((long)local_1a00 + (long)(iVar54 * 0x20) * 4);
          local_1a08 = (undefined8 *)((long)local_1a08 + (long)(iVar54 * 0x20) * 4);
          local_1a10 = (undefined8 *)((long)local_1a10 + (long)(iVar54 * 0x20) * 4);
          local_1a18 = (undefined8 *)((long)local_1a18 + (long)(iVar54 * 0x20) * 4);
          local_1a20 = (undefined8 *)((long)local_1a20 + (long)(iVar54 * 0x20) * 4);
          local_1a28 = (undefined8 *)((long)local_1a28 + (long)(iVar54 * 0x20) * 4);
          local_1a30 = (undefined8 *)((long)local_1a30 + (long)(iVar54 * 0x20) * 4);
          local_1a38 = (undefined8 *)((long)local_1a38 + (long)(iVar54 * 0x20) * 4);
        }
      }
    }
  }
  return;
}

Assistant:

static void conv3x3s1_winograd63_transform_input_pack4_sse(const Mat& bottom_blob, Mat& bottom_blob_tm, const Option& opt)
{
    const int w = bottom_blob.w;
    const int h = bottom_blob.h;
    const int inch = bottom_blob.c;

    const int w_tiles = (w - 2) / 6;
    const int h_tiles = (h - 2) / 6;
    const int tiles = w_tiles * h_tiles;

    // const float itm[8][8] = {
    //     {1.0f,  0.0f, -5.25f,  0.00f,  5.25f,  0.00f, -1.0f, 0.0f},
    //
    //     {0.0f,  1.0f,  1.00f, -4.25f, -4.25f,  1.00f,  1.0f, 0.0f},
    //     {0.0f, -1.0f,  1.00f,  4.25f, -4.25f, -1.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  0.5f,  0.25f, -2.50f, -1.25f,  2.00f,  1.0f, 0.0f},
    //     {0.0f, -0.5f,  0.25f,  2.50f, -1.25f, -2.00f,  1.0f, 0.0f},
    //
    //     {0.0f,  2.0f,  4.00f, -2.50f, -5.00f,  0.50f,  1.0f, 0.0f},
    //     {0.0f, -2.0f,  4.00f,  2.50f, -5.00f, -0.50f,  1.0f, 0.0f},
    //
    //     {0.0f, -1.0f,  0.00f,  5.25f,  0.00f, -5.25f,  0.0f, 1.0f}
    // };

    // 0 = r00 - r06 + (r04 - r02) * 5.25
    // 7 = r07 - r01 + (r03 - r05) * 5.25

    // 1 = (r02 + r06 - r04 * 4.25) + (r01 - r03 * 4.25 + r05)
    // 2 = (r02 + r06 - r04 * 4.25) - (r01 - r03 * 4.25 + r05)

    // 3 = (r06 + r02 * 0.25 - r04 * 1.25) + (r01 * 0.5 - r03 * 2.5 + r05 * 2)
    // 4 = (r06 + r02 * 0.25 - r04 * 1.25) - (r01 * 0.5 - r03 * 2.5 + r05 * 2)

    // reuse r04 * 1.25
    // reuse r03 * 2.5
    // 5 = (r06 + (r02 - r04 * 1.25) * 4) + (r01 * 2 - r03 * 2.5 + r05 * 0.5)
    // 6 = (r06 + (r02 - r04 * 1.25) * 4) - (r01 * 2 - r03 * 2.5 + r05 * 0.5)

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const Mat img0 = bottom_blob.channel(q);
        Mat img0_tm = bottom_blob_tm.channel(q);

#ifdef _MSC_VER
        __declspec(align(16))
#else
        __attribute__((aligned(16)))
#endif
        float tmp[8][8][4];

        __m128 _v5_25 = _mm_set1_ps(5.25f);
        __m128 _vm4_25 = _mm_set1_ps(-4.25f);
        __m128 _vm1_25 = _mm_set1_ps(-1.25f);
        __m128 _v0_25 = _mm_set1_ps(0.25f);
        __m128 _vm2_5 = _mm_set1_ps(-2.5f);
        __m128 _v0_5 = _mm_set1_ps(0.5f);
        __m128 _v2 = _mm_set1_ps(2.f);
        __m128 _v4 = _mm_set1_ps(4.f);

        // tile
        for (int i = 0; i < h_tiles; i++)
        {
            for (int j = 0; j < w_tiles; j++)
            {
                const float* r0 = img0.row(i * 6) + (j * 6) * 4;

                for (int m = 0; m < 8; m++)
                {
                    __m128 _r00 = _mm_load_ps(r0);
                    __m128 _r01 = _mm_load_ps(r0 + 4);
                    __m128 _r02 = _mm_load_ps(r0 + 4 * 2);
                    __m128 _r03 = _mm_load_ps(r0 + 4 * 3);
                    __m128 _r04 = _mm_load_ps(r0 + 4 * 4);
                    __m128 _r05 = _mm_load_ps(r0 + 4 * 5);
                    __m128 _r06 = _mm_load_ps(r0 + 4 * 6);
                    __m128 _r07 = _mm_load_ps(r0 + 4 * 7);

                    __m128 _tmp0m = _mm_comp_fmadd_ps(_v5_25, _mm_sub_ps(_r04, _r02), _mm_sub_ps(_r00, _r06));
                    __m128 _tmp7m = _mm_comp_fmadd_ps(_v5_25, _mm_sub_ps(_r03, _r05), _mm_sub_ps(_r07, _r01));
                    _mm_store_ps(tmp[0][m], _tmp0m);
                    _mm_store_ps(tmp[7][m], _tmp7m);

                    __m128 _tmp12a = _mm_comp_fmadd_ps(_vm4_25, _r04, _mm_add_ps(_r02, _r06));
                    __m128 _tmp12b = _mm_comp_fmadd_ps(_vm4_25, _r03, _mm_add_ps(_r01, _r05));

                    __m128 _tmp1m = _mm_add_ps(_tmp12a, _tmp12b);
                    __m128 _tmp2m = _mm_sub_ps(_tmp12a, _tmp12b);
                    _mm_store_ps(tmp[1][m], _tmp1m);
                    _mm_store_ps(tmp[2][m], _tmp2m);

                    __m128 _tmp34a = _mm_comp_fmadd_ps(_vm1_25, _r04, _mm_comp_fmadd_ps(_v0_25, _r02, _r06));
                    __m128 _tmp34b = _mm_comp_fmadd_ps(_v2, _r05, _mm_comp_fmadd_ps(_vm2_5, _r03, _mm_mul_ps(_r01, _v0_5)));

                    __m128 _tmp3m = _mm_add_ps(_tmp34a, _tmp34b);
                    __m128 _tmp4m = _mm_sub_ps(_tmp34a, _tmp34b);
                    _mm_store_ps(tmp[3][m], _tmp3m);
                    _mm_store_ps(tmp[4][m], _tmp4m);

                    __m128 _tmp56a = _mm_comp_fmadd_ps(_v4, _mm_comp_fmadd_ps(_vm1_25, _r04, _r02), _r06);
                    __m128 _tmp56b = _mm_comp_fmadd_ps(_v0_5, _r05, _mm_comp_fmadd_ps(_vm2_5, _r03, _mm_mul_ps(_r01, _v2)));

                    __m128 _tmp5m = _mm_add_ps(_tmp56a, _tmp56b);
                    __m128 _tmp6m = _mm_sub_ps(_tmp56a, _tmp56b);
                    _mm_store_ps(tmp[5][m], _tmp5m);
                    _mm_store_ps(tmp[6][m], _tmp6m);

                    r0 += w * 4;
                }

                float* r0_tm_0 = (float*)img0_tm + (i * w_tiles + j) * 4;
                float* r0_tm_1 = r0_tm_0 + tiles * 4;
                float* r0_tm_2 = r0_tm_0 + tiles * 4 * 2;
                float* r0_tm_3 = r0_tm_0 + tiles * 4 * 3;
                float* r0_tm_4 = r0_tm_0 + tiles * 4 * 4;
                float* r0_tm_5 = r0_tm_0 + tiles * 4 * 5;
                float* r0_tm_6 = r0_tm_0 + tiles * 4 * 6;
                float* r0_tm_7 = r0_tm_0 + tiles * 4 * 7;

                for (int m = 0; m < 8; m++)
                {
                    __m128 _tmp00 = _mm_load_ps(tmp[m][0]);
                    __m128 _tmp01 = _mm_load_ps(tmp[m][1]);
                    __m128 _tmp02 = _mm_load_ps(tmp[m][2]);
                    __m128 _tmp03 = _mm_load_ps(tmp[m][3]);
                    __m128 _tmp04 = _mm_load_ps(tmp[m][4]);
                    __m128 _tmp05 = _mm_load_ps(tmp[m][5]);
                    __m128 _tmp06 = _mm_load_ps(tmp[m][6]);
                    __m128 _tmp07 = _mm_load_ps(tmp[m][7]);

                    __m128 _r0tm0 = _mm_comp_fmadd_ps(_v5_25, _mm_sub_ps(_tmp04, _tmp02), _mm_sub_ps(_tmp00, _tmp06));
                    __m128 _r0tm7 = _mm_comp_fmadd_ps(_v5_25, _mm_sub_ps(_tmp03, _tmp05), _mm_sub_ps(_tmp07, _tmp01));

                    __m128 _tmp12a = _mm_comp_fmadd_ps(_vm4_25, _tmp04, _mm_add_ps(_tmp02, _tmp06));
                    __m128 _tmp12b = _mm_comp_fmadd_ps(_vm4_25, _tmp03, _mm_add_ps(_tmp01, _tmp05));

                    __m128 _r0tm1 = _mm_add_ps(_tmp12a, _tmp12b);
                    __m128 _r0tm2 = _mm_sub_ps(_tmp12a, _tmp12b);

                    __m128 _tmp34a = _mm_comp_fmadd_ps(_vm1_25, _tmp04, _mm_comp_fmadd_ps(_v0_25, _tmp02, _tmp06));
                    __m128 _tmp34b = _mm_comp_fmadd_ps(_v2, _tmp05, _mm_comp_fmadd_ps(_vm2_5, _tmp03, _mm_mul_ps(_tmp01, _v0_5)));

                    __m128 _r0tm3 = _mm_add_ps(_tmp34a, _tmp34b);
                    __m128 _r0tm4 = _mm_sub_ps(_tmp34a, _tmp34b);

                    __m128 _tmp56a = _mm_comp_fmadd_ps(_v4, _mm_comp_fmadd_ps(_vm1_25, _tmp04, _tmp02), _tmp06);
                    __m128 _tmp56b = _mm_comp_fmadd_ps(_v0_5, _tmp05, _mm_comp_fmadd_ps(_vm2_5, _tmp03, _mm_mul_ps(_tmp01, _v2)));

                    __m128 _r0tm5 = _mm_add_ps(_tmp56a, _tmp56b);
                    __m128 _r0tm6 = _mm_sub_ps(_tmp56a, _tmp56b);

                    _mm_store_ps(r0_tm_0, _r0tm0);
                    _mm_store_ps(r0_tm_1, _r0tm1);
                    _mm_store_ps(r0_tm_2, _r0tm2);
                    _mm_store_ps(r0_tm_3, _r0tm3);
                    _mm_store_ps(r0_tm_4, _r0tm4);
                    _mm_store_ps(r0_tm_5, _r0tm5);
                    _mm_store_ps(r0_tm_6, _r0tm6);
                    _mm_store_ps(r0_tm_7, _r0tm7);

                    r0_tm_0 += tiles * 4 * 8;
                    r0_tm_1 += tiles * 4 * 8;
                    r0_tm_2 += tiles * 4 * 8;
                    r0_tm_3 += tiles * 4 * 8;
                    r0_tm_4 += tiles * 4 * 8;
                    r0_tm_5 += tiles * 4 * 8;
                    r0_tm_6 += tiles * 4 * 8;
                    r0_tm_7 += tiles * 4 * 8;
                }
            }
        }
    }
}